

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O0

int nn_sinproc_recv(nn_pipebase *self,nn_msg *msg)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  bool bVar3;
  nn_fsm *local_30;
  nn_sinproc *sinproc;
  int rc;
  nn_msg *msg_local;
  nn_pipebase *self_local;
  
  if (self == (nn_pipebase *)0x0) {
    local_30 = (nn_fsm *)0x0;
  }
  else {
    local_30 = (nn_fsm *)&self[-1].data;
  }
  bVar3 = true;
  if (*(int *)&local_30[1].fn != 4) {
    bVar3 = *(int *)&local_30[1].fn == 5;
  }
  if (bVar3) {
    iVar1 = nn_msgqueue_recv((nn_msgqueue *)&local_30[3].stopped.src,msg);
    __stream = _stderr;
    if (iVar1 != 0) {
      pcVar2 = nn_err_strerror(-iVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
              ,0xbf);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((*(int *)&local_30[1].fn != 5) && (((ulong)local_30[1].fn & 0x200000000) != 0)) {
      iVar1 = nn_msgqueue_send((nn_msgqueue *)&local_30[3].stopped.src,
                               (nn_msg *)(local_30[1].shutdown_fn + 0x180));
      if (iVar1 != 0 && iVar1 != -0xb) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0 || rc == -EAGAIN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
                ,0xc6);
        fflush(_stderr);
        nn_err_abort();
      }
      if (iVar1 == 0) {
        nn_msg_init((nn_msg *)(local_30[1].shutdown_fn + 0x180),0);
        nn_fsm_raiseto(local_30,(nn_fsm *)local_30[1].shutdown_fn,
                       (nn_fsm_event *)(local_30[1].shutdown_fn + 0x230),0x6c41,5,local_30);
        *(uint *)((long)&local_30[1].fn + 4) = *(uint *)((long)&local_30[1].fn + 4) & 0xfffffffd;
      }
    }
    iVar1 = nn_msgqueue_empty((nn_msgqueue *)&local_30[3].stopped.src);
    if (iVar1 == 0) {
      nn_pipebase_received((nn_pipebase *)&local_30[1].state);
    }
    return 0;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
          "sinproc->state == NN_SINPROC_STATE_ACTIVE || sinproc->state == NN_SINPROC_STATE_DISCONNECTED"
          ,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
          ,0xbb);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_sinproc_recv (struct nn_pipebase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, pipebase);

    /*  Sanity check. */
    nn_assert (sinproc->state == NN_SINPROC_STATE_ACTIVE ||
        sinproc->state == NN_SINPROC_STATE_DISCONNECTED);

    /*  Move the message to the caller. */
    rc = nn_msgqueue_recv (&sinproc->msgqueue, msg);
    errnum_assert (rc == 0, -rc);

    /*  If there was a message from peer lingering because of the exceeded
        buffer limit, try to enqueue it once again. */
    if (sinproc->state != NN_SINPROC_STATE_DISCONNECTED) {
        if (nn_slow (sinproc->flags & NN_SINPROC_FLAG_RECEIVING)) {
            rc = nn_msgqueue_send (&sinproc->msgqueue, &sinproc->peer->msg);
            nn_assert (rc == 0 || rc == -EAGAIN);
            if (rc == 0) {
                errnum_assert (rc == 0, -rc);
                nn_msg_init (&sinproc->peer->msg, 0);
                nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
                    &sinproc->peer->event_received, NN_SINPROC_SRC_PEER,
                    NN_SINPROC_RECEIVED, sinproc);
                sinproc->flags &= ~NN_SINPROC_FLAG_RECEIVING;
            }
        }
    }

    if (!nn_msgqueue_empty (&sinproc->msgqueue))
       nn_pipebase_received (&sinproc->pipebase);

    return 0;
}